

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infofnt_text_std(wchar_t x,wchar_t y,wchar_t *str,wchar_t len)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  term_data *td;
  wchar_t h;
  wchar_t w;
  wchar_t i;
  wchar_t len_local;
  wchar_t *str_local;
  wchar_t y_local;
  wchar_t x_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pvVar1 = Term->data;
  if ((str == (wchar_t *)0x0) || (*str == L'\0')) {
    y_local = L'\xffffffff';
  }
  else {
    w = len;
    if (len < L'\0') {
      sVar4 = wcslen(str);
      w = (wchar_t)sVar4;
    }
    iVar2 = y * *(int *)((long)pvVar1 + 0xf0) + (int)Infowin->oy;
    iVar3 = x * *(int *)((long)pvVar1 + 0xe8) + (int)Infowin->ox;
    XFillRectangle(Metadpy->dpy,Infowin->win,clr[0]->gc,iVar3,iVar2,
                   w * *(int *)((long)pvVar1 + 0xe8),
                   CONCAT44(uVar5,*(undefined4 *)((long)pvVar1 + 0xf0)));
    iVar2 = Infofnt->asc + iVar2;
    if ((Infofnt->field_0x19 & 1) == 0) {
      XwcDrawImageString(Metadpy->dpy,Infowin->win,Infofnt->fs,Infoclr->gc,iVar3,iVar2,str,w);
    }
    else {
      for (h = L'\0'; h < w; h = h + L'\x01') {
        XwcDrawImageString(Metadpy->dpy,Infowin->win,Infofnt->fs,Infoclr->gc,
                           iVar3 + h * *(int *)((long)pvVar1 + 0xe8) + (uint)Infofnt->off,iVar2,
                           str + h,1);
      }
    }
    y_local = L'\0';
  }
  return y_local;
}

Assistant:

static errr Infofnt_text_std(int x, int y, const wchar_t *str, int len)
{
	int i;
	int w, h;

	term_data *td = (term_data*)(Term->data);

	/*** Do a brief info analysis ***/

	/* Do nothing if the string is null */
	if (!str || !*str) return (-1);

	/* Get the length of the string */
	if (len < 0) len = wcslen(str);

	/*** Decide where to place the string, vertically ***/

	/* Ignore Vertical Justifications */
	y = (y * td->tile_hgt) + Infowin->oy;


	/*** Decide where to place the string, horizontally ***/

	/* Line up with x at left edge of column 'x' */
	x = (x * td->tile_wid) + Infowin->ox;

	/*** Erase the background ***/

	/* The total width will be 'len' chars * standard width */
	w = len * td->tile_wid;

	/* Simply do 'td->tile_hgt' (a single row) high */
	h = td->tile_hgt;

	/* Fill the background */
	XFillRectangle(Metadpy->dpy, Infowin->win, clr[COLOUR_DARK]->gc,
				   x, y, w, h);


	/*** Actually draw 'str' onto the infowin ***/
	y += Infofnt->asc;


	/*** Handle the fake mono we can enforce on fonts ***/

	/* Monotize the font */
	if (Infofnt->mono) {
		/* Do each character */
		for (i = 0; i < len; ++i) {
			/* Note that the Infoclr is set up to contain the Infofnt */
			XwcDrawImageString(Metadpy->dpy, Infowin->win, Infofnt->fs,
							   Infoclr->gc, x + i * td->tile_wid + Infofnt->off,
							   y, str + i, 1);
		}
	} else {
		/* Note that the Infoclr is set up to contain the Infofnt */
		XwcDrawImageString(Metadpy->dpy, Infowin->win, Infofnt->fs, Infoclr->gc,
		                 x, y, str, len);
	}

	/* Success */
	return (0);
}